

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O3

int __thiscall
cbtDbvt::clone(cbtDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtDbvtNode *pcVar3;
  cbtDbvtNode *pcVar4;
  cbtDbvtNode *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int extraout_EAX;
  uint uVar9;
  int extraout_EAX_00;
  sStkCLN *psVar10;
  cbtDbvtNode *pcVar11;
  cbtDbvtNode **ppcVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  cbtAlignedObjectArray<cbtDbvt::sStkCLN> stack;
  cbtAlignedObjectArray<cbtDbvt::sStkCLN> cStack_58;
  long *local_38;
  
  local_38 = (long *)__child_stack;
  clear((cbtDbvt *)__fn);
  pcVar11 = this->m_root;
  if (pcVar11 == (cbtDbvtNode *)0x0) {
    return extraout_EAX;
  }
  cStack_58.m_ownsMemory = true;
  cStack_58.m_data = (sStkCLN *)0x0;
  cStack_58.m_size = 0;
  cStack_58.m_capacity = 0;
  uVar16 = this->m_leaves;
  if ((long)(int)uVar16 < 1) {
    uVar14 = 1;
  }
  else {
    psVar10 = (sStkCLN *)cbtAlignedAllocInternal((long)(int)uVar16 << 4,0x10);
    if ((long)cStack_58.m_size < 1) {
      if (cStack_58.m_data != (sStkCLN *)0x0) goto LAB_008a3d09;
    }
    else {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar13);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&psVar10->node + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar13 = lVar13 + 0x10;
      } while ((long)cStack_58.m_size << 4 != lVar13);
LAB_008a3d09:
      if (cStack_58.m_ownsMemory == true) {
        cbtAlignedFreeInternal(cStack_58.m_data);
      }
    }
    pcVar11 = this->m_root;
    uVar9 = cStack_58.m_size;
    if ((cStack_58.m_size != uVar16) ||
       (uVar14 = uVar16 * 2, uVar9 = uVar16, cStack_58.m_data = psVar10,
       cStack_58.m_capacity = uVar16, SBORROW4(uVar16,uVar14) == 0 < (int)uVar16))
    goto LAB_008a3da5;
  }
  cStack_58.m_ownsMemory = true;
  psVar10 = (sStkCLN *)cbtAlignedAllocInternal((ulong)uVar14 << 4,0x10);
  uVar9 = cStack_58.m_size;
  uVar16 = uVar14;
  if ((long)cStack_58.m_size < 1) {
    if (cStack_58.m_data == (sStkCLN *)0x0) goto LAB_008a3da5;
  }
  else {
    lVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar13);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&psVar10->node + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar13 = lVar13 + 0x10;
    } while ((long)cStack_58.m_size << 4 != lVar13);
  }
  if (cStack_58.m_ownsMemory == true) {
    cbtAlignedFreeInternal(cStack_58.m_data);
    uVar9 = cStack_58.m_size;
  }
LAB_008a3da5:
  cStack_58.m_capacity = uVar16;
  cStack_58.m_data = psVar10;
  cStack_58.m_ownsMemory = true;
  cStack_58.m_size = uVar9 + 1;
  cStack_58.m_data[(int)uVar9].node = pcVar11;
  cStack_58.m_data[(int)uVar9].parent = (cbtDbvtNode *)0x0;
  do {
    pcVar11 = *(cbtDbvtNode **)(__fn + 8);
    uVar16 = cStack_58.m_size - 1;
    pcVar3 = cStack_58.m_data[(long)cStack_58.m_size + -1].node;
    pcVar4 = cStack_58.m_data[(long)cStack_58.m_size + -1].parent;
    pcVar5 = (pcVar3->field_2).childs[0];
    if (pcVar11 == (cbtDbvtNode *)0x0) {
      pcVar11 = (cbtDbvtNode *)cbtAlignedAllocInternal(0x38,0x10);
      (pcVar11->volume).mx.m_floats[2] = 0.0;
      (pcVar11->volume).mx.m_floats[3] = 0.0;
      pcVar11->parent = (cbtDbvtNode *)0x0;
      (pcVar11->field_2).childs[0] = (cbtDbvtNode *)0x0;
      (pcVar11->field_2).childs[1] = (cbtDbvtNode *)0x0;
      (pcVar11->volume).mi.m_floats[0] = 0.0;
      (pcVar11->volume).mi.m_floats[1] = 0.0;
      (pcVar11->volume).mi.m_floats[2] = 0.0;
      (pcVar11->volume).mi.m_floats[3] = 0.0;
      (pcVar11->volume).mx.m_floats[0] = 0.0;
      (pcVar11->volume).mx.m_floats[1] = 0.0;
      (pcVar11->volume).mx.m_floats[2] = 0.0;
      (pcVar11->volume).mx.m_floats[3] = 0.0;
      cStack_58.m_size = cStack_58.m_size - 1;
    }
    else {
      *(undefined8 *)(__fn + 8) = 0;
      cStack_58.m_size = uVar16;
    }
    pcVar11->parent = pcVar4;
    (pcVar11->field_2).childs[0] = pcVar5;
    (pcVar11->field_2).childs[1] = (cbtDbvtNode *)0x0;
    uVar6 = *(undefined8 *)((pcVar3->volume).mi.m_floats + 2);
    uVar7 = *(undefined8 *)(pcVar3->volume).mx.m_floats;
    uVar8 = *(undefined8 *)((pcVar3->volume).mx.m_floats + 2);
    ppcVar12 = (cbtDbvtNode **)((long)(&pcVar4->volume + 1) + ((ulong)(uVar16 & 1) + 1) * 8);
    if (pcVar4 == (cbtDbvtNode *)0x0) {
      ppcVar12 = (cbtDbvtNode **)__fn;
    }
    *(undefined8 *)(pcVar11->volume).mi.m_floats = *(undefined8 *)(pcVar3->volume).mi.m_floats;
    *(undefined8 *)((pcVar11->volume).mi.m_floats + 2) = uVar6;
    *(undefined8 *)(pcVar11->volume).mx.m_floats = uVar7;
    *(undefined8 *)((pcVar11->volume).mx.m_floats + 2) = uVar8;
    *ppcVar12 = pcVar11;
    if ((pcVar3->field_2).childs[1] == (cbtDbvtNode *)0x0) {
      (**(code **)(*local_38 + 0x10))(local_38,pcVar11);
    }
    else {
      pcVar4 = (pcVar3->field_2).childs[0];
      uVar16 = cStack_58.m_capacity;
      if (cStack_58.m_size == cStack_58.m_capacity) {
        uVar14 = cStack_58.m_size * 2;
        if (cStack_58.m_size == 0) {
          uVar14 = 1;
        }
        uVar16 = cStack_58.m_size;
        if (cStack_58.m_size < (int)uVar14) {
          if (uVar14 == 0) {
            psVar10 = (sStkCLN *)0x0;
          }
          else {
            psVar10 = (sStkCLN *)cbtAlignedAllocInternal((long)(int)uVar14 << 4,0x10);
          }
          if (cStack_58.m_size < 1) {
            if (cStack_58.m_data != (sStkCLN *)0x0) goto LAB_008a3ef2;
          }
          else {
            lVar13 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar13);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&psVar10->node + lVar13);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              lVar13 = lVar13 + 0x10;
            } while ((ulong)(uint)cStack_58.m_size << 4 != lVar13);
LAB_008a3ef2:
            if (cStack_58.m_ownsMemory == true) {
              cbtAlignedFreeInternal(cStack_58.m_data);
            }
          }
          cStack_58.m_ownsMemory = true;
          uVar16 = uVar14;
          cStack_58.m_data = psVar10;
          cStack_58.m_capacity = uVar14;
        }
      }
      uVar9 = cStack_58.m_size + 1;
      cStack_58.m_data[cStack_58.m_size].node = pcVar4;
      cStack_58.m_data[cStack_58.m_size].parent = pcVar11;
      pcVar3 = (pcVar3->field_2).childs[1];
      uVar14 = uVar9;
      if (uVar9 == uVar16) {
        uVar15 = uVar16 * 2;
        if (uVar16 == 0) {
          uVar15 = 1;
        }
        uVar14 = uVar16;
        if ((int)uVar16 < (int)uVar15) {
          cStack_58.m_size = uVar9;
          if (uVar15 == 0) {
            psVar10 = (sStkCLN *)0x0;
          }
          else {
            psVar10 = (sStkCLN *)cbtAlignedAllocInternal((long)(int)uVar15 << 4,0x10);
            uVar16 = cStack_58.m_size;
          }
          if ((int)uVar16 < 1) {
            if (cStack_58.m_data != (sStkCLN *)0x0) goto LAB_008a3fa6;
          }
          else {
            lVar13 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar13);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&psVar10->node + lVar13);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              lVar13 = lVar13 + 0x10;
            } while ((ulong)uVar16 << 4 != lVar13);
LAB_008a3fa6:
            if (cStack_58.m_ownsMemory == true) {
              cbtAlignedFreeInternal(cStack_58.m_data);
              uVar16 = cStack_58.m_size;
            }
          }
          cStack_58.m_ownsMemory = true;
          uVar14 = uVar16;
          cStack_58.m_data = psVar10;
          cStack_58.m_capacity = uVar15;
        }
      }
      cStack_58.m_size = uVar14 + 1;
      cStack_58.m_data[(int)uVar14].node = pcVar3;
      cStack_58.m_data[(int)uVar14].parent = pcVar11;
    }
    if (cStack_58.m_size < 1) {
      cbtAlignedObjectArray<cbtDbvt::sStkCLN>::~cbtAlignedObjectArray(&cStack_58);
      return extraout_EAX_00;
    }
  } while( true );
}

Assistant:

void cbtDbvt::clone(cbtDbvt& dest, IClone* iclone) const
{
	dest.clear();
	if (m_root != 0)
	{
		cbtAlignedObjectArray<sStkCLN> stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root, 0));
		do
		{
			const int i = stack.size() - 1;
			const sStkCLN e = stack[i];
			cbtDbvtNode* n = createnode(&dest, e.parent, e.node->volume, e.node->data);
			stack.pop_back();
			if (e.parent != 0)
				e.parent->childs[i & 1] = n;
			else
				dest.m_root = n;
			if (e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0], n));
				stack.push_back(sStkCLN(e.node->childs[1], n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while (stack.size() > 0);
	}
}